

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

SimpleString __thiscall MemoryAccountant::report(MemoryAccountant *this)

{
  char *pcVar1;
  size_t extraout_RDX;
  long *in_RSI;
  SimpleString SVar3;
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  long local_60;
  MemoryAccountantAllocationNode *node;
  undefined1 local_48 [16];
  undefined1 local_38 [24];
  SimpleString accountantReport;
  MemoryAccountant *this_local;
  size_t sVar2;
  
  if (*in_RSI == 0) {
    SVar3 = reportNoAllocations(this);
    sVar2 = SVar3.bufferSize_;
  }
  else {
    reportTitle((MemoryAccountant *)local_38);
    reportHeader((MemoryAccountant *)local_48);
    SimpleString::operator+((SimpleString *)(local_38 + 0x10),(SimpleString *)local_38);
    SimpleString::~SimpleString((SimpleString *)local_48);
    SimpleString::~SimpleString((SimpleString *)local_38);
    for (local_60 = *in_RSI; local_60 != 0; local_60 = *(long *)(local_60 + 0x28)) {
      stringSize((MemoryAccountant *)local_80,(size_t)in_RSI);
      pcVar1 = SimpleString::asCharString((SimpleString *)local_80);
      StringFromFormat(local_80 + 0x10,"%s               %5d            %5d             %5d\n",
                       pcVar1,(ulong)*(uint *)(local_60 + 8),(ulong)*(uint *)(local_60 + 0x10),
                       (ulong)*(uint *)(local_60 + 0x18));
      SimpleString::operator+=((SimpleString *)(local_38 + 0x10),(SimpleString *)(local_80 + 0x10));
      SimpleString::~SimpleString((SimpleString *)(local_80 + 0x10));
      SimpleString::~SimpleString((SimpleString *)local_80);
    }
    reportFooter((MemoryAccountant *)local_90);
    SimpleString::operator+((SimpleString *)this,(SimpleString *)(local_38 + 0x10));
    SimpleString::~SimpleString((SimpleString *)local_90);
    SimpleString::~SimpleString((SimpleString *)(local_38 + 0x10));
    sVar2 = extraout_RDX;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString MemoryAccountant::report() const
{
    if (head_ == NULLPTR)
      return reportNoAllocations();

    SimpleString accountantReport = reportTitle() + reportHeader();

    for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_)
        accountantReport += StringFromFormat(MEMORY_ACCOUNTANT_ROW_FORMAT, stringSize(node->size_).asCharString(), (int) node->allocations_, (int) node->deallocations_, (int) node->maxAllocations_);

    return accountantReport + reportFooter();
}